

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analysis.cpp
# Opt level: O0

void __thiscall
Analysis::UpdateParameterDict(Analysis *this,string *param_filename,int argc,char **argv)

{
  string *in_RSI;
  double dVar1;
  Analysis *in_stack_000001b0;
  string *in_stack_000028c8;
  ParameterReader *in_stack_000028d0;
  ParameterReader *this_00;
  string *this_01;
  string *in_stack_ffffffffffffff60;
  ParameterReader *in_stack_ffffffffffffff68;
  long in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  char **in_stack_ffffffffffffff90;
  long in_stack_ffffffffffffff98;
  ParameterReader *in_stack_ffffffffffffffa0;
  string local_40 [64];
  
  this_01 = local_40;
  std::__cxx11::string::string(this_01,in_RSI);
  ParameterReader::readFromFile(in_stack_000028d0,in_stack_000028c8);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff90,"#",(allocator *)&stack0xffffffffffffff8f);
  ParameterReader::readFromArguments
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
  this_00 = (ParameterReader *)&stack0xffffffffffffff67;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff68,"readRapidityShiftFromFile",(allocator *)this_00);
  dVar1 = ParameterReader::getVal
                    (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,(double)this_01);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
  if ((dVar1 == 1.0) && (!NAN(dVar1))) {
    setRapiditySfhitFromFile(in_stack_000001b0);
  }
  ParameterReader::echo(this_00);
  return;
}

Assistant:

void Analysis::UpdateParameterDict(
    std::string param_filename, int argc, char *argv[]) {
    paraRdr_.readFromFile(param_filename);
    paraRdr_.readFromArguments(argc, argv);

    // rapidity shift from file
    if (paraRdr_.getVal("readRapidityShiftFromFile", 0) == 1) {
        setRapiditySfhitFromFile();
    }
    paraRdr_.echo();
}